

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O2

bool __thiscall boost::thread::start_thread_noexcept(thread *this,attributes *attr)

{
  int iVar1;
  type ptVar2;
  bool bVar3;
  int detached_state;
  int local_34;
  shared_ptr<boost::detail::thread_data_base> local_30;
  
  ptVar2 = shared_ptr<boost::detail::thread_data_base>::operator->(&this->thread_info);
  shared_ptr<boost::detail::thread_data_base>::operator=(&ptVar2->self,&this->thread_info);
  ptVar2 = shared_ptr<boost::detail::thread_data_base>::operator->(&this->thread_info);
  iVar1 = pthread_create(&ptVar2->thread_handle,(pthread_attr_t *)attr,
                         (anonymous_namespace)::thread_proxy,(this->thread_info).px);
  if (iVar1 == 0) {
    iVar1 = pthread_attr_getdetachstate((pthread_attr_t *)attr,&local_34);
    bVar3 = iVar1 == 0;
    if (bVar3) {
      if (local_34 == 1) {
        local_30.px = (this->thread_info).px;
        (this->thread_info).px = (element_type *)0x0;
        local_30.pn.pi_ = (this->thread_info).pn.pi_;
        (this->thread_info).pn.pi_ = (sp_counted_base *)0x0;
        if (local_30.px != (element_type *)0x0) {
          ptVar2 = shared_ptr<boost::detail::thread_data_base>::operator->(&local_30);
          if (ptVar2->join_started == false) {
            ptVar2 = shared_ptr<boost::detail::thread_data_base>::operator->(&local_30);
            ptVar2->join_started = true;
            ptVar2 = shared_ptr<boost::detail::thread_data_base>::operator->(&local_30);
            ptVar2->joined = true;
          }
        }
        detail::shared_count::~shared_count(&local_30.pn);
      }
    }
    else {
      ptVar2 = shared_ptr<boost::detail::thread_data_base>::operator->(&this->thread_info);
      shared_ptr<boost::detail::thread_data_base>::reset(&ptVar2->self);
    }
  }
  else {
    ptVar2 = shared_ptr<boost::detail::thread_data_base>::operator->(&this->thread_info);
    shared_ptr<boost::detail::thread_data_base>::reset(&ptVar2->self);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool thread::start_thread_noexcept(const attributes& attr)
    {
        thread_info->self=thread_info;
        const attributes::native_handle_type* h = attr.native_handle();
        int res = pthread_create(&thread_info->thread_handle, h, &thread_proxy, thread_info.get());
        if (res != 0)
        {
            thread_info->self.reset();
            return false;
        }
        int detached_state;
        res = pthread_attr_getdetachstate(h, &detached_state);
        if (res != 0)
        {
            thread_info->self.reset();
            return false;
        }
        if (PTHREAD_CREATE_DETACHED==detached_state)
        {
          detail::thread_data_ptr local_thread_info;
          thread_info.swap(local_thread_info);

          if(local_thread_info)
          {
              //lock_guard<mutex> lock(local_thread_info->data_mutex);
              if(!local_thread_info->join_started)
              {
                  //BOOST_VERIFY(!pthread_detach(local_thread_info->thread_handle));
                  local_thread_info->join_started=true;
                  local_thread_info->joined=true;
              }
          }
        }
        return true;
    }